

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

bool __thiscall
cmsys::RegularExpression::find(RegularExpression *this,char *string,RegularExpressionMatch *rmatch)

{
  char cVar1;
  char **ppcVar2;
  int iVar3;
  undefined1 local_50 [8];
  RegExpFind regFind;
  char *s;
  RegularExpressionMatch *rmatch_local;
  char *string_local;
  RegularExpression *this_local;
  
  RegularExpressionMatch::clear(rmatch);
  rmatch->searchstring = string;
  if (this->program == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else if (*this->program == -100) {
    ppcVar2 = (char **)string;
    if (this->regmust != (char *)0x0) {
      while ((regFind.regendp = ppcVar2,
             regFind.regendp = (char **)strchr((char *)regFind.regendp,(int)*this->regmust),
             regFind.regendp != (char **)0x0 &&
             (iVar3 = strncmp((char *)regFind.regendp,this->regmust,this->regmlen), iVar3 != 0))) {
        ppcVar2 = (char **)((long)regFind.regendp + 1);
      }
      if (regFind.regendp == (char **)0x0) {
        return false;
      }
    }
    regFind.reginput = string;
    if (this->reganch == '\0') {
      regFind.regendp = (char **)string;
      if (this->regstart == '\0') {
        do {
          iVar3 = RegExpFind::regtry((RegExpFind *)local_50,(char *)regFind.regendp,rmatch->startp,
                                     rmatch->endp,this->program);
          if (iVar3 != 0) {
            return true;
          }
          cVar1 = *(char *)regFind.regendp;
          regFind.regendp = (char **)((long)regFind.regendp + 1);
        } while (cVar1 != '\0');
      }
      else {
        while (regFind.regendp = (char **)strchr((char *)regFind.regendp,(int)this->regstart),
              regFind.regendp != (char **)0x0) {
          iVar3 = RegExpFind::regtry((RegExpFind *)local_50,(char *)regFind.regendp,rmatch->startp,
                                     rmatch->endp,this->program);
          if (iVar3 != 0) {
            return true;
          }
          regFind.regendp = (char **)((long)regFind.regendp + 1);
        }
      }
      this_local._7_1_ = false;
    }
    else {
      iVar3 = RegExpFind::regtry((RegExpFind *)local_50,string,rmatch->startp,rmatch->endp,
                                 this->program);
      this_local._7_1_ = iVar3 != 0;
    }
  }
  else {
    printf("RegularExpression::find(): Compiled regular expression corrupted.\n");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RegularExpression::find(char const* string,
                             RegularExpressionMatch& rmatch) const
{
  const char* s;

  rmatch.clear();
  rmatch.searchstring = string;

  if (!this->program) {
    return false;
  }

  // Check validity of program.
  if (UCHARAT(this->program) != MAGIC) {
    // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
    printf(
      "RegularExpression::find(): Compiled regular expression corrupted.\n");
    return false;
  }

  // If there is a "must appear" string, look for it.
  if (this->regmust != KWSYS_NULLPTR) {
    s = string;
    while ((s = strchr(s, this->regmust[0])) != KWSYS_NULLPTR) {
      if (strncmp(s, this->regmust, this->regmlen) == 0)
        break; // Found it.
      s++;
    }
    if (s == KWSYS_NULLPTR) // Not present.
      return false;
  }

  RegExpFind regFind;

  // Mark beginning of line for ^ .
  regFind.regbol = string;

  // Simplest case:  anchored match need be tried only once.
  if (this->reganch)
    return (
      regFind.regtry(string, rmatch.startp, rmatch.endp, this->program) != 0);

  // Messy cases:  unanchored match.
  s = string;
  if (this->regstart != '\0')
    // We know what char it must start with.
    while ((s = strchr(s, this->regstart)) != KWSYS_NULLPTR) {
      if (regFind.regtry(s, rmatch.startp, rmatch.endp, this->program))
        return true;
      s++;
    }
  else
    // We don't -- general case.
    do {
      if (regFind.regtry(s, rmatch.startp, rmatch.endp, this->program))
        return true;
    } while (*s++ != '\0');

  // Failure.
  return false;
}